

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O1

void pzshape::TPZShapeDisc::Polynomial
               (REAL C,REAL x0,REAL x,int degree,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
               int n)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  if (degree < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZShapeDisc::Polynomial the degree of the polynomial cannot be minus, aborting\n",
               0x50);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeDisc.cpp"
               ,0x69);
  }
  uVar1 = degree + 1;
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (phi,(long)(int)uVar1,1);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (dphi,(long)n,(long)(int)uVar1);
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *phi->fElem = 1.0;
  if (degree != 0) {
    dVar8 = (x - x0) / C;
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    phi->fElem[1] = dVar8;
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow] = 1.0 / C;
    if (1 < degree) {
      uVar7 = 2;
      lVar5 = 8;
      lVar6 = 0x10;
      do {
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar7) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar7) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[uVar7] = phi->fElem[uVar7 - 1] * dVar8;
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < (long)uVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar7) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar7] =
             dphi->fElem[(uVar7 - 1) * (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow] *
             dVar8 + phi->fElem[uVar7 - 1] / C;
        if (1 < n) {
          uVar4 = 2;
          do {
            if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar4) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < (long)uVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar2 <= (long)(uVar4 - 2)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < (long)uVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar3 < (long)uVar4) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             uVar4 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6 + -8) =
                 *(double *)((long)dphi->fElem + uVar4 * 8 + lVar5 * lVar2 + -8) * dVar8 +
                 ((double)(int)uVar4 / C) *
                 *(double *)((long)dphi->fElem + uVar4 * 8 + lVar5 * lVar3 + -0x10);
            uVar4 = uVar4 + 1;
          } while (uVar4 != n + 1);
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 8;
        lVar6 = lVar6 + 8;
      } while (uVar7 != uVar1);
    }
  }
  return;
}

Assistant:

void TPZShapeDisc::Polynomial(REAL C,REAL x0,REAL x,int degree,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, int n){
#ifdef PZDEBUG
  if(IsZero(C)){
    DebugStop();
  }
#endif
   if(degree < 0){
      PZError << "TPZShapeDisc::Polynomial the degree of the polynomial cannot be minus, aborting\n";
      DebugStop();
   }
   phi.Redim(degree+1,1);
   dphi.Redim(n,degree+1);
   //grau zero ou constante
   phi(0,0) = 1.0;
   if(degree == 0) return;
   //grau 1
   REAL val = (x-x0)/C;
   phi(1,0) = val;
   dphi(0,1) = 1./C; 
   //grau maior que 1
   int p;
   degree++;
   for(p = 2;p < degree; p++) {
      phi(p,0) = phi(p-1,0)*val;
      int ideriv;
      dphi(0,p) = dphi(0,p-1)*val+phi(p-1,0)/C;
      for(ideriv=2; ideriv<=n; ideriv++) {
	 dphi(ideriv-1,p) = val*dphi(ideriv-1,p-1)+(ideriv/C)*dphi(ideriv-2,p-1);
      }
   }
}